

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O0

string * GetNearestAirportId_abi_cxx11_(positionTy *_pos,positionTy *outApPos)

{
  double *pdVar1;
  positionTy *in_RDX;
  positionTy *in_RSI;
  string *in_RDI;
  double dVar2;
  float alt;
  XPLMNavRef navRef;
  float lon;
  float lat;
  char airportId [33];
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  string *this;
  allocator<char> local_59;
  float local_58;
  int local_54;
  float local_50;
  float local_4c;
  undefined1 local_48 [48];
  positionTy *local_18;
  positionTy *local_10;
  
  this = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  memset(local_48,0,0x21);
  dVar2 = positionTy::lat(local_10);
  local_4c = (float)dVar2;
  dVar2 = positionTy::lon(local_10);
  local_50 = (float)dVar2;
  local_54 = XPLMFindNavAid(0,0,&local_4c,&local_50,0,1);
  if (local_54 != 0) {
    local_58 = 0.0;
    XPLMGetNavAidInfo(local_54,0,&local_4c,&local_50,&local_58,0,0,local_48,0,0);
    if (local_18 != (positionTy *)0x0) {
      dVar2 = (double)local_4c;
      pdVar1 = positionTy::lat(local_18);
      *pdVar1 = dVar2;
      in_stack_ffffffffffffff70 = (allocator<char> *)(double)local_50;
      pdVar1 = positionTy::lon(local_18);
      *pdVar1 = (double)in_stack_ffffffffffffff70;
      in_stack_ffffffffffffff78 = (char *)(double)local_58;
      pdVar1 = positionTy::alt_m(local_18);
      *pdVar1 = (double)in_stack_ffffffffffffff78;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::allocator<char>::~allocator(&local_59);
  return in_RDI;
}

Assistant:

std::string GetNearestAirportId (const positionTy& _pos,
                                 positionTy* outApPos)
{
    char airportId[33] = "";

    // Find the nearest airport
    float lat = (float)_pos.lat();
    float lon = (float)_pos.lon();
    XPLMNavRef navRef = XPLMFindNavAid(nullptr, nullptr,
                                       &lat, &lon, nullptr,
                                       xplm_Nav_Airport);
    if (navRef) {
        // fetch airport info
        float alt = 0.0f;
        XPLMGetNavAidInfo(navRef, nullptr, &lat, &lon, &alt, nullptr, nullptr,
                          airportId, nullptr, nullptr);
        // fill output structure
        if (outApPos) {
            outApPos->lat() = lat;
            outApPos->lon() = lon;
            outApPos->alt_m() = alt;
        }
    }
    
    // return the id
    return airportId;
}